

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QTtfGlyph>::emplace<QTtfGlyph_const&>
          (QMovableArrayOps<QTtfGlyph> *this,qsizetype i,QTtfGlyph *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QTtfGlyph> *in_RSI;
  QArrayDataPointer<QTtfGlyph> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QTtfGlyph tmp;
  QTtfGlyph *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff84;
  byte bVar6;
  GrowthPosition where;
  Inserter local_60;
  undefined1 local_38 [48];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QTtfGlyph>::needsDetach
                    ((QArrayDataPointer<QTtfGlyph> *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QTtfGlyph> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QTtfGlyph>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QTtfGlyph>::end
                ((QArrayDataPointer<QTtfGlyph> *)
                 CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      QTtfGlyph::QTtfGlyph
                ((QTtfGlyph *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00788ea8;
    }
    if ((in_RSI == (QArrayDataPointer<QTtfGlyph> *)0x0) &&
       (qVar3 = QArrayDataPointer<QTtfGlyph>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QTtfGlyph>::begin((QArrayDataPointer<QTtfGlyph> *)0x788d7a);
      QTtfGlyph::QTtfGlyph
                ((QTtfGlyph *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00788ea8;
    }
  }
  memset(local_38,0xaa,0x30);
  QTtfGlyph::QTtfGlyph
            ((QTtfGlyph *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QTtfGlyph> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QTtfGlyph> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QTtfGlyph>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff84,uVar2))),
             (QTtfGlyph **)in_RDI,
             (QArrayDataPointer<QTtfGlyph> *)CONCAT17(uVar5,in_stack_ffffffffffffff70));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff84,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff70),
                       (qsizetype)in_stack_ffffffffffffff68);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
    Inserter::~Inserter(&local_60);
  }
  else {
    QArrayDataPointer<QTtfGlyph>::begin((QArrayDataPointer<QTtfGlyph> *)0x788e3c);
    QTtfGlyph::QTtfGlyph
              ((QTtfGlyph *)CONCAT17(uVar5,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QTtfGlyph::~QTtfGlyph((QTtfGlyph *)0x788ea8);
LAB_00788ea8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }